

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *
TryParseHex<std::byte>(string_view str)

{
  bool bVar1;
  char cVar2;
  const_iterator pvVar3;
  optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *poVar4;
  optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *in_RDI;
  long in_FS_OFFSET;
  char c2;
  char c1;
  const_iterator it;
  vector<std::byte,_std::allocator<std::byte>_> vch;
  undefined7 in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff5f;
  undefined7 in_stack_ffffffffffffff60;
  char in_stack_ffffffffffffff67;
  optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *in_stack_ffffffffffffff68;
  undefined1 *__n;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  const_iterator local_58;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __n = local_30;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::vector<std::byte,_std::allocator<std::byte>_>::reserve
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),(size_type)__n);
  local_58 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
LAB_00fa7aae:
  do {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (local_58 == pvVar3) {
      std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::
      optional<std::vector<std::byte,_std::allocator<std::byte>_>,_true>
                (in_stack_ffffffffffffff68,
                 (vector<std::byte,_std::allocator<std::byte>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
LAB_00fa7c19:
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffff68);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    bVar1 = IsSpace(in_stack_ffffffffffffff5f);
    if (!bVar1) {
      in_stack_ffffffffffffff68 =
           (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)(local_58 + 1);
      cVar2 = HexDigit(in_stack_ffffffffffffff5f);
      poVar4 = (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      if (in_stack_ffffffffffffff68 == poVar4) {
        std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::optional(in_RDI);
        goto LAB_00fa7c19;
      }
      local_58 = local_58 + 2;
      in_stack_ffffffffffffff67 = HexDigit(in_stack_ffffffffffffff5f);
      if ((cVar2 < '\0') || (in_stack_ffffffffffffff67 < '\0')) {
        std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::optional(in_RDI);
        goto LAB_00fa7c19;
      }
      std::vector<std::byte,_std::allocator<std::byte>_>::push_back
                ((vector<std::byte,_std::allocator<std::byte>_> *)
                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                 (value_type *)0xfa7bfb);
      goto LAB_00fa7aae;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

std::optional<std::vector<Byte>> TryParseHex(std::string_view str)
{
    std::vector<Byte> vch;
    vch.reserve(str.size() / 2); // two hex characters form a single byte

    auto it = str.begin();
    while (it != str.end()) {
        if (IsSpace(*it)) {
            ++it;
            continue;
        }
        auto c1 = HexDigit(*(it++));
        if (it == str.end()) return std::nullopt;
        auto c2 = HexDigit(*(it++));
        if (c1 < 0 || c2 < 0) return std::nullopt;
        vch.push_back(Byte(c1 << 4) | Byte(c2));
    }
    return vch;
}